

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O1

CURLcode Curl_ntlm_core_mk_nt_hash(char *password,uchar *ntbuffer)

{
  size_t sVar1;
  curl_malloc_callback *pp_Var2;
  uchar *input;
  size_t sVar3;
  CURLcode CVar4;
  char *pcVar5;
  
  sVar1 = strlen(password);
  CVar4 = CURLE_OUT_OF_MEMORY;
  if (-1 < (long)sVar1) {
    if (sVar1 == 0) {
      pcVar5 = "";
      pp_Var2 = (curl_malloc_callback *)&Curl_cstrdup;
    }
    else {
      pp_Var2 = &Curl_cmalloc;
      pcVar5 = (char *)(sVar1 * 2);
    }
    input = (uchar *)(**pp_Var2)(pcVar5);
    if (input != (uchar *)0x0) {
      if (sVar1 != 0) {
        sVar3 = 0;
        do {
          input[sVar3 * 2] = password[sVar3];
          input[sVar3 * 2 + 1] = '\0';
          sVar3 = sVar3 + 1;
        } while (sVar1 != sVar3);
      }
      Curl_md4it(ntbuffer,input,sVar1 * 2);
      ntbuffer[0x14] = '\0';
      ntbuffer[0x10] = '\0';
      ntbuffer[0x11] = '\0';
      ntbuffer[0x12] = '\0';
      ntbuffer[0x13] = '\0';
      (*Curl_cfree)(input);
      CVar4 = CURLE_OK;
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_ntlm_core_mk_nt_hash(const char *password,
                                   unsigned char *ntbuffer /* 21 bytes */)
{
  size_t len = strlen(password);
  unsigned char *pw;
  if(len > SIZE_T_MAX/2) /* avoid integer overflow */
    return CURLE_OUT_OF_MEMORY;
  pw = len ? malloc(len * 2) : (unsigned char *)strdup("");
  if(!pw)
    return CURLE_OUT_OF_MEMORY;

  ascii_to_unicode_le(pw, password, len);

  /* Create NT hashed password. */
  Curl_md4it(ntbuffer, pw, 2 * len);
  memset(ntbuffer + 16, 0, 21 - 16);

  free(pw);

  return CURLE_OK;
}